

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
btBvhTriangleMeshShape::setOptimizedBvh
          (btBvhTriangleMeshShape *this,btOptimizedBvh *bvh,btVector3 *scaling)

{
  int iVar1;
  undefined4 extraout_var;
  btScalar bVar2;
  btVector3 local_20;
  
  this->m_bvh = bvh;
  this->m_ownsBvh = false;
  iVar1 = (*(this->super_btTriangleMeshShape).super_btConcaveShape.super_btCollisionShape.
            _vptr_btCollisionShape[7])();
  local_20 = operator-((btVector3 *)CONCAT44(extraout_var,iVar1),scaling);
  bVar2 = btVector3::length2(&local_20);
  if (1.1920929e-07 < bVar2) {
    btTriangleMeshShape::setLocalScaling(&this->super_btTriangleMeshShape,scaling);
  }
  return;
}

Assistant:

void   btBvhTriangleMeshShape::setOptimizedBvh(btOptimizedBvh* bvh, const btVector3& scaling)
{
   btAssert(!m_bvh);
   btAssert(!m_ownsBvh);

   m_bvh = bvh;
   m_ownsBvh = false;
   // update the scaling without rebuilding the bvh
   if ((getLocalScaling() -scaling).length2() > SIMD_EPSILON)
   {
      btTriangleMeshShape::setLocalScaling(scaling);
   }
}